

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_column.h
# Opt level: O1

bool Gudhi::persistence_matrix::operator==
               (Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
                *c1,Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
                    *c2)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  bool bVar3;
  _Rb_tree_header *p_Var4;
  _Rb_tree_header *p_Var5;
  
  bVar3 = true;
  if (c1 != c2) {
    if ((c1->column_)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
        (c2->column_)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      p_Var2 = (c2->column_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = (c1->column_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var5 = &(c1->column_)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = &(c2->column_)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var2 != p_Var4 && (_Rb_tree_header *)p_Var1 != p_Var5) {
        do {
          if (((*(int **)(p_Var1 + 1))[1] != (*(int **)(p_Var2 + 1))[1]) ||
             (**(int **)(p_Var1 + 1) != **(int **)(p_Var2 + 1))) goto LAB_00117c90;
          p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
          p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
        } while (((_Rb_tree_header *)p_Var1 != p_Var5) && ((_Rb_tree_header *)p_Var2 != p_Var4));
      }
    }
    else {
LAB_00117c90:
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool operator==(const Set_column& c1, const Set_column& c2) {
    if (&c1 == &c2) return true;

    auto it1 = c1.column_.begin();
    auto it2 = c2.column_.begin();
    if (c1.column_.size() != c2.column_.size()) return false;
    while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
      if constexpr (Master_matrix::Option_list::is_z2) {
        if ((*it1)->get_row_index() != (*it2)->get_row_index()) return false;
      } else {
        if ((*it1)->get_row_index() != (*it2)->get_row_index() || (*it1)->get_element() != (*it2)->get_element())
          return false;
      }
      ++it1;
      ++it2;
    }
    return true;
  }